

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void row_numberValueFunc(sqlite3_context *pCtx)

{
  Mem *pMem;
  i64 *piVar1;
  i64 val;
  
  if ((short)pCtx->pMem->flags < 0) {
    piVar1 = (i64 *)pCtx->pMem->z;
  }
  else {
    piVar1 = (i64 *)createAggContext(pCtx,8);
  }
  if (piVar1 == (i64 *)0x0) {
    val = 0;
  }
  else {
    val = *piVar1;
  }
  pMem = pCtx->pOut;
  if ((pMem->flags & 0x9000) != 0) {
    vdbeReleaseAndSetInt64(pMem,val);
    return;
  }
  (pMem->u).i = val;
  pMem->flags = 4;
  return;
}

Assistant:

static void row_numberValueFunc(sqlite3_context *pCtx){
  i64 *p = (i64*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  sqlite3_result_int64(pCtx, (p ? *p : 0));
}